

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNet.cpp
# Opt level: O3

void __thiscall
PyreNet::NeuralNet::mutate_uniform(NeuralNet *this,double lower,double upper,int layer)

{
  Layer *pLVar1;
  ulong uVar2;
  undefined8 *puVar3;
  iterator __begin2;
  Layer *this_00;
  pointer_____offset_0x10___ *ppuVar4;
  
  pLVar1 = (this->layers).super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  this_00 = (this->layers).super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar2 = (long)pLVar1 - (long)this_00 >> 5;
  if ((uVar2 < 3) || (this->inputSize == 0)) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = &PTR__exception_0010cd20;
    ppuVar4 = &InvalidNetworkSize::typeinfo;
  }
  else {
    if (layer == -1) {
      for (; this_00 != pLVar1; this_00 = this_00 + 1) {
        Layer::mutate_uniform(this_00,lower,upper);
      }
      return;
    }
    if ((-1 < layer) && ((uint)layer < uVar2)) {
      Layer::mutate_uniform(this_00 + (uint)layer,lower,upper);
      return;
    }
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = &PTR__exception_0010cce0;
    ppuVar4 = &InvalidLayer::typeinfo;
  }
  __cxa_throw(puVar3,ppuVar4,std::exception::~exception);
}

Assistant:

void NeuralNet::mutate_uniform(const double lower, const double upper, int layer) {
        if (this->layers.size() < 3 || this->inputSize == 0) throw InvalidNetworkSize();
        if (layer == -1) {
            for (Layer &l : this->layers) {
                l.mutate_uniform(lower, upper);
            }
        } else {
            if (layer < 0 || layer >= this->layers.size())
                throw InvalidLayer();
            this->layers[layer].mutate_uniform(lower, upper);
        }
    }